

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O0

void __thiscall Scs::Client::~Client(Client *this)

{
  Client *this_local;
  
  ~Client(this);
  operator_delete(this,0x170);
  return;
}

Assistant:

Client::~Client()
{
	m_status = Status::Shutdown;
	if (m_thread.joinable())
		m_thread.join();
}